

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

string * utils::format<int>(string *__return_storage_ptr__,int *value)

{
  int iVar1;
  stringstream ss;
  locale alStack_1a8 [8];
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  if (format<int>(int_const&)::loc == '\0') {
    iVar1 = __cxa_guard_acquire(&format<int>(int_const&)::loc);
    if (iVar1 != 0) {
      std::locale::locale((locale *)&format<int>(int_const&)::loc,"");
      __cxa_atexit(std::locale::~locale,&format<int>(int_const&)::loc,&__dso_handle);
      __cxa_guard_release(&format<int>(int_const&)::loc);
    }
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ios::imbue(alStack_1a8);
  std::locale::~locale(alStack_1a8);
  std::ostream::operator<<(local_190,*value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

inline std::string format(const T &value)
    {
        static std::locale loc("");
        std::stringstream ss;
        ss.imbue(loc);
        ss << value;
        return ss.str();
    }